

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

TestCaseGroup * vkt::memory::createPipelineBarrierTests(TestContext *testCtx)

{
  pointer pcVar1;
  bool bVar2;
  TestCaseGroup *pTVar3;
  TestNode *pTVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> usageGroup;
  pointer local_1f8;
  uint local_1ec;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  string usageGroupName;
  string testName;
  
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"pipeline_barrier","Pipeline barrier tests.");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar3;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    local_1ec = (&DAT_009c8430)[lVar6];
    for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
      uVar8 = (&DAT_009c4600)[lVar5] | local_1ec;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&testName);
      bVar2 = true;
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 0x10) {
        if ((*(uint *)((long)&DAT_00c012d0 + lVar7) & uVar8) != 0) {
          if (!bVar2) {
            std::operator<<((ostream *)&testName,"_");
          }
          std::operator<<((ostream *)&testName,
                          *(char **)((long)&PTR_anon_var_dwarf_9c1a6b_00c012d8 + lVar7));
          bVar2 = false;
        }
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testName);
      pTVar3 = (TestCaseGroup *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                (pTVar3,testCtx,usageGroupName._M_dataplus._M_p,usageGroupName._M_dataplus._M_p);
      usageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = pTVar3;
      for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 8) {
        pcVar1 = *(pointer *)((long)&DAT_009c8410 + lVar7);
        local_1f8 = pcVar1;
        de::toString<unsigned_long>(&testName,(unsigned_long *)&local_1f8);
        pTVar3 = usageGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        pTVar4 = (TestNode *)operator_new(0x90);
        TestCase::TestCase((TestCase *)pTVar4,testCtx,NODETYPE_SELF_VALIDATE,&testName,&testName);
        pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c013e0;
        *(uint *)&pTVar4[1].m_testCtx = uVar8;
        pTVar4[1].m_name._M_dataplus._M_p = pcVar1;
        *(undefined4 *)&pTVar4[1].m_name._M_string_length = 0;
        tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar4);
        std::__cxx11::string::~string((string *)&testName);
      }
      tcu::TestNode::addChild
                (&(group.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,
                 &(usageGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode);
      usageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&usageGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      std::__cxx11::string::~string((string *)&usageGroupName);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testName,"all",(allocator<char> *)&usageGroupName);
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar3,testCtx,testName._M_dataplus._M_p,testName._M_dataplus._M_p);
  usageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar3;
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
    pcVar1 = *(pointer *)((long)&DAT_009c8410 + lVar6);
    local_1f8 = pcVar1;
    de::toString<unsigned_long>(&usageGroupName,(unsigned_long *)&local_1f8);
    pTVar3 = usageGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar4 = (TestNode *)operator_new(0x90);
    TestCase::TestCase((TestCase *)pTVar4,testCtx,NODETYPE_SELF_VALIDATE,&usageGroupName,
                       &usageGroupName);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c013e0;
    *(undefined4 *)&pTVar4[1].m_testCtx = 0x1bff;
    pTVar4[1].m_name._M_dataplus._M_p = pcVar1;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 0;
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar4);
    std::__cxx11::string::~string((string *)&usageGroupName);
  }
  tcu::TestNode::addChild
            (&(group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr)->super_TestNode,
             &(usageGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode);
  usageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&usageGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  std::__cxx11::string::~string((string *)&testName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testName,"all_device",(allocator<char> *)&usageGroupName);
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar3,testCtx,testName._M_dataplus._M_p,testName._M_dataplus._M_p);
  usageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar3;
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
    pcVar1 = *(pointer *)((long)&DAT_009c8410 + lVar6);
    local_1f8 = pcVar1;
    de::toString<unsigned_long>(&usageGroupName,(unsigned_long *)&local_1f8);
    pTVar3 = usageGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar4 = (TestNode *)operator_new(0x90);
    TestCase::TestCase((TestCase *)pTVar4,testCtx,NODETYPE_SELF_VALIDATE,&usageGroupName,
                       &usageGroupName);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c013e0;
    *(undefined4 *)&pTVar4[1].m_testCtx = 0x1bfc;
    pTVar4[1].m_name._M_dataplus._M_p = pcVar1;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 0;
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar4);
    std::__cxx11::string::~string((string *)&usageGroupName);
  }
  tcu::TestNode::addChild
            (&(group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr)->super_TestNode,
             &(usageGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode);
  usageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&usageGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  std::__cxx11::string::~string((string *)&testName);
  pTVar3 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createPipelineBarrierTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "pipeline_barrier", "Pipeline barrier tests."));
	const vk::VkDeviceSize			sizes[]			=
	{
		1024,		// 1K
		8*1024,		// 8K
		64*1024,	// 64K
		1024*1024,	// 1M
	};
	const Usage						usages[]		=
	{
		USAGE_HOST_READ,
		USAGE_HOST_WRITE,
		USAGE_TRANSFER_SRC,
		USAGE_TRANSFER_DST,
		USAGE_VERTEX_BUFFER,
		USAGE_INDEX_BUFFER,
		USAGE_UNIFORM_BUFFER,
		USAGE_UNIFORM_TEXEL_BUFFER,
		USAGE_STORAGE_BUFFER,
		USAGE_STORAGE_TEXEL_BUFFER,
		USAGE_STORAGE_IMAGE,
		USAGE_SAMPLED_IMAGE
	};
	const Usage						readUsages[]		=
	{
		USAGE_HOST_READ,
		USAGE_TRANSFER_SRC,
		USAGE_VERTEX_BUFFER,
		USAGE_INDEX_BUFFER,
		USAGE_UNIFORM_BUFFER,
		USAGE_UNIFORM_TEXEL_BUFFER,
		USAGE_STORAGE_BUFFER,
		USAGE_STORAGE_TEXEL_BUFFER,
		USAGE_STORAGE_IMAGE,
		USAGE_SAMPLED_IMAGE
	};

	const Usage						writeUsages[]	=
	{
		USAGE_HOST_WRITE,
		USAGE_TRANSFER_DST
	};

	for (size_t writeUsageNdx = 0; writeUsageNdx < DE_LENGTH_OF_ARRAY(writeUsages); writeUsageNdx++)
	{
		const Usage	writeUsage	= writeUsages[writeUsageNdx];

		for (size_t readUsageNdx = 0; readUsageNdx < DE_LENGTH_OF_ARRAY(readUsages); readUsageNdx++)
		{
			const Usage						readUsage		= readUsages[readUsageNdx];
			const Usage						usage			= writeUsage | readUsage;
			const string					usageGroupName	(usageToName(usage));
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					usage,
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}
	}

	{
		Usage all = (Usage)0;

		for (size_t usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
			all = all | usages[usageNdx];

		{
			const string					usageGroupName	("all");
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					all,
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}

		{
			const string					usageGroupName	("all_device");
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					(Usage)(all & (~(USAGE_HOST_READ|USAGE_HOST_WRITE))),
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}
	}

	return group.release();
}